

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O2

Embed * __thiscall discordpp::Embed::operator=(Embed *this,Embed *param_1)

{
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::operator=
            (&(this->title).
              super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ,&(param_1->title).
               super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::operator=
            (&(this->type).
              super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ,&(param_1->type).
               super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::operator=
            (&(this->description).
              super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ,&(param_1->description).
               super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::operator=
            (&(this->url).
              super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ,&(param_1->url).
               super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::operator=
            (&(this->timestamp).
              super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ,&(param_1->timestamp).
               super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  field<int>::operator=(&(this->color).super_field<int>,&(param_1->color).super_field<int>);
  field<discordpp::EmbedFooter>::operator=
            (&(this->footer).super_field<discordpp::EmbedFooter>,
             &(param_1->footer).super_field<discordpp::EmbedFooter>);
  field<discordpp::EmbedImage>::operator=
            (&(this->image).super_field<discordpp::EmbedImage>,
             &(param_1->image).super_field<discordpp::EmbedImage>);
  field<discordpp::EmbedThumbnail>::operator=
            (&(this->thumbnail).super_field<discordpp::EmbedThumbnail>,
             &(param_1->thumbnail).super_field<discordpp::EmbedThumbnail>);
  field<discordpp::EmbedVideo>::operator=
            (&(this->video).super_field<discordpp::EmbedVideo>,
             &(param_1->video).super_field<discordpp::EmbedVideo>);
  field<discordpp::EmbedProvider>::operator=
            (&(this->provider).super_field<discordpp::EmbedProvider>,
             &(param_1->provider).super_field<discordpp::EmbedProvider>);
  field<discordpp::EmbedAuthor>::operator=
            (&(this->author).super_field<discordpp::EmbedAuthor>,
             &(param_1->author).super_field<discordpp::EmbedAuthor>);
  field<std::vector<discordpp::EmbedField,_std::allocator<discordpp::EmbedField>_>_>::operator=
            (&(this->fields).
              super_field<std::vector<discordpp::EmbedField,_std::allocator<discordpp::EmbedField>_>_>
             ,&(param_1->fields).
               super_field<std::vector<discordpp::EmbedField,_std::allocator<discordpp::EmbedField>_>_>
            );
  return this;
}

Assistant:

Embed(
        omittable_field<std::string> title = omitted,
        omittable_field<std::string> type = omitted,
        omittable_field<std::string> description = omitted,
        omittable_field<std::string> url = omitted,
        omittable_field<Timestamp> timestamp = omitted,
        omittable_field<int> color = omitted,
        omittable_field<EmbedFooter> footer = omitted,
        omittable_field<EmbedImage> image = omitted,
        omittable_field<EmbedThumbnail> thumbnail = omitted,
        omittable_field<EmbedVideo> video = omitted,
        omittable_field<EmbedProvider> provider = omitted,
        omittable_field<EmbedAuthor> author = omitted,
        omittable_field<std::vector<EmbedField> > fields = omitted
    ):
        title(title),
        type(type),
        description(description),
        url(url),
        timestamp(timestamp),
        color(color),
        footer(footer),
        image(image),
        thumbnail(thumbnail),
        video(video),
        provider(provider),
        author(author),
        fields(fields)
    {}